

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O1

void __thiscall
TestClass::SyncFunc6
          (TestClass *this,uint64_t *p1,uint32_t *p2,uint16_t *p3,uint8_t *p4,int64_t *p5,
          int32_t *p6)

{
  SyncEventAgent *this_00;
  void *__buf;
  int __flags;
  
  __flags = (int)p4;
  this_00 = (SyncEventAgent *)
            operator_new(0x60,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0xb5);
  (this_00->super_EventAgent).super_Event.super_RefCount.mRefCount = 0;
  *(undefined8 *)&(this_00->super_EventAgent).super_Event.super_RefCount.field_0xc = 0xfffffffb;
  (this_00->super_EventAgent).super_Event.super_RefCount._vptr_RefCount =
       (_func_int **)&PTR_onRefCountZero_00110828;
  this_00[1].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)this;
  *(code **)&this_00[1].super_EventAgent.super_Event.super_RefCount.mRefCount = handleSyncFunc6;
  *(undefined8 *)&this_00[1].super_EventAgent.super_Event.mPriority = 0;
  this_00[2].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p1;
  *(uint32_t **)&this_00[2].super_EventAgent.super_Event.super_RefCount.mRefCount = p2;
  *(uint16_t **)&this_00[2].super_EventAgent.super_Event.mPriority = p3;
  this_00[3].super_EventAgent.super_Event.super_RefCount._vptr_RefCount = (_func_int **)p4;
  *(int64_t **)&this_00[3].super_EventAgent.super_Event.super_RefCount.mRefCount = p5;
  *(int32_t **)&this_00[3].super_EventAgent.super_Event.mPriority = p6;
  SyncEventAgent::send(this_00,(int)this + 8,__buf,(size_t)p5,__flags);
  return;
}

Assistant:

void SyncFunc6(uint64_t &p1, uint32_t &p2, uint16_t &p3, uint8_t &p4,
				   int64_t &p5, int32_t &p6)
	{
		SyncEventAgent6<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &, int64_t &, int32_t &> *agent =
			jh_new SyncEventAgent6<TestClass, uint64_t &, uint32_t &, uint16_t &, uint8_t &, int64_t &, int32_t &>(this, &TestClass::handleSyncFunc6,
			p1, p2, p3, p4, p5, p6);
		agent->send(&mEventThread);
		LOG_INFO("Sync6 result %llu, %u, %u, %u, %lld, %d", p1, p2, p3, p4, p5, p6);
	}